

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::BlitColorConversionCase::render(BlitColorConversionCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  deUint32 *pdVar1;
  deUint32 internalformat;
  int srcX1;
  int srcY1;
  uint uVar2;
  bool bVar3;
  deUint32 *renderbuffers;
  Vector<float,_4> VVar4;
  bool bVar5;
  int i_6;
  DataType outputType;
  DataType outputType_00;
  deUint32 program;
  Vec4 *pVVar6;
  Context *pCVar7;
  deUint32 *pdVar8;
  deUint32 *pdVar9;
  Vec4 *pVVar10;
  int i;
  long lVar11;
  Vec4 *pVVar12;
  TextureFormatInfo *pTVar13;
  Vec4 *pVVar14;
  TextureFormatInfo *pTVar15;
  Vec4 *pVVar16;
  Vec4 *pVVar17;
  Vec4 *pVVar18;
  int i_3;
  TextureFormatInfo *pTVar19;
  Vec4 *pVVar20;
  int i_4;
  Vec4 *pVVar21;
  deUint32 *framebuffers;
  uint uVar22;
  undefined1 auVar23 [16];
  uint uVar24;
  deUint32 dstFbo;
  deUint32 srcFbo;
  BlitColorConversionCase *local_450;
  deUint32 srcRbo;
  deUint32 local_440;
  deUint32 dstRbo;
  Vector<float,_4> res_7;
  Vector<bool,_4> res;
  float fStack_424;
  float afStack_420 [4];
  TextureFormat dstFormat;
  TextureFormatInfo dstRangeInfo;
  TextureFormat srcFormat;
  TextureFormatInfo srcRangeInfo;
  TextureFormatInfo dstFmtRangeInfo;
  TextureFormatInfo srcFmtRangeInfo;
  GradientShader gradientToDstShader;
  GradientShader gradientToSrcShader;
  
  srcFormat = glu::mapGLInternalFormat(this->m_srcFormat);
  local_450 = this;
  dstFormat = glu::mapGLInternalFormat(this->m_dstFormat);
  outputType = FboTestUtil::getFragmentOutputType(&srcFormat);
  outputType_00 = FboTestUtil::getFragmentOutputType(&dstFormat);
  pTVar13 = &srcFmtRangeInfo;
  tcu::getTextureFormatInfo(pTVar13,&srcFormat);
  pTVar19 = &dstFmtRangeInfo;
  tcu::getTextureFormatInfo(pTVar19,&dstFormat);
  uVar22 = 1;
  switch(srcFormat.order) {
  case RG:
    uVar24 = 0x101;
    break;
  case RA:
  case ARGB:
  case BGR:
  case BGRA:
  case sR:
  case sRG:
switchD_012bc0ed_caseD_6:
    uVar24 = 0;
    break;
  case RGB:
  case sRGB:
    uVar24 = 0x10101;
    break;
  case RGBA:
  case sRGBA:
    uVar24 = 0x1010101;
    break;
  default:
    uVar24 = uVar22;
    if (srcFormat.order != R) goto switchD_012bc0ed_caseD_6;
  }
  switch(dstFormat.order) {
  case RG:
    uVar22 = 0x101;
    break;
  case RGB:
  case sRGB:
    uVar22 = 0x10101;
    break;
  case RGBA:
  case sRGBA:
    uVar22 = 0x1010101;
    break;
  default:
    if (dstFormat.order == R) break;
  case RA:
  case ARGB:
  case BGR:
  case BGRA:
  case sR:
  case sRG:
    uVar22 = 0;
  }
  pVVar6 = &srcFmtRangeInfo.valueMax;
  pVVar10 = &dstFmtRangeInfo.valueMax;
  auVar23._4_4_ =
       -(uint)(dstFmtRangeInfo.valueMax.m_data[1] - dstFmtRangeInfo.valueMin.m_data[1] <
              srcFmtRangeInfo.valueMax.m_data[1] - srcFmtRangeInfo.valueMin.m_data[1]);
  auVar23._0_4_ =
       -(uint)(dstFmtRangeInfo.valueMax.m_data[0] - dstFmtRangeInfo.valueMin.m_data[0] <
              srcFmtRangeInfo.valueMax.m_data[0] - srcFmtRangeInfo.valueMin.m_data[0]);
  auVar23._8_4_ =
       -(uint)(dstFmtRangeInfo.valueMax.m_data[2] - dstFmtRangeInfo.valueMin.m_data[2] <
              srcFmtRangeInfo.valueMax.m_data[2] - srcFmtRangeInfo.valueMin.m_data[2]);
  auVar23._12_4_ =
       -(uint)(dstFmtRangeInfo.valueMax.m_data[3] - dstFmtRangeInfo.valueMin.m_data[3] <
              srcFmtRangeInfo.valueMax.m_data[3] - srcFmtRangeInfo.valueMin.m_data[3]);
  auVar23 = packssdw(auVar23,auVar23);
  auVar23 = packsswb(auVar23,auVar23);
  uVar2 = auVar23._0_4_ & (uint)DAT_01b805f0;
  srcFbo = uVar22 & uVar24 & uVar2;
  res.m_data[0] = (bool)(char)srcFbo;
  res.m_data[1] = (bool)(char)(srcFbo >> 8);
  res.m_data[2] = (bool)(char)(srcFbo >> 0x10);
  res.m_data[3] = (bool)(char)(srcFbo >> 0x18);
  gradientToSrcShader.super_ShaderProgram.super_VertexShader._0_16_ = ZEXT816(0);
  lVar11 = 0;
  do {
    pTVar15 = pTVar19;
    if (res.m_data[lVar11] == false) {
      pTVar15 = pTVar13;
    }
    *(float *)((long)&gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader
              + lVar11 * 4) = (pTVar15->valueMin).m_data[0];
    lVar11 = lVar11 + 1;
    pTVar13 = (TextureFormatInfo *)((pTVar13->valueMin).m_data + 1);
    pTVar19 = (TextureFormatInfo *)((pTVar19->valueMin).m_data + 1);
  } while (lVar11 != 4);
  gradientToDstShader.super_ShaderProgram.super_VertexShader._0_16_ = ZEXT816(0);
  lVar11 = 0;
  pVVar12 = pVVar10;
  pVVar16 = pVVar6;
  do {
    pVVar17 = pVVar12;
    if (*(char *)((long)&srcFbo + lVar11) == '\0') {
      pVVar17 = pVVar16;
    }
    *(float *)((long)&gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader
              + lVar11 * 4) = pVVar17->m_data[0];
    lVar11 = lVar11 + 1;
    pVVar16 = (Vec4 *)(pVVar16->m_data + 1);
    pVVar12 = (Vec4 *)(pVVar12->m_data + 1);
  } while (lVar11 != 4);
  pVVar12 = &dstFmtRangeInfo.lookupScale;
  dstFbo = srcFbo;
  pVVar16 = &srcFmtRangeInfo.lookupScale;
  dstRangeInfo.valueMin.m_data[0] = 0.0;
  dstRangeInfo.valueMin.m_data[1] = 0.0;
  dstRangeInfo.valueMin.m_data[2] = 0.0;
  dstRangeInfo.valueMin.m_data[3] = 0.0;
  lVar11 = 0;
  pVVar17 = pVVar12;
  pVVar18 = pVVar16;
  do {
    pVVar20 = pVVar17;
    if (*(char *)((long)&dstFbo + lVar11) == '\0') {
      pVVar20 = pVVar18;
    }
    dstRangeInfo.valueMin.m_data[lVar11] = pVVar20->m_data[0];
    lVar11 = lVar11 + 1;
    pVVar18 = (Vec4 *)(pVVar18->m_data + 1);
    pVVar17 = (Vec4 *)(pVVar17->m_data + 1);
  } while (lVar11 != 4);
  pVVar17 = &dstFmtRangeInfo.lookupBias;
  srcRbo = srcFbo;
  pVVar18 = &srcFmtRangeInfo.lookupBias;
  res_7.m_data[0] = 0.0;
  res_7.m_data[1] = 0.0;
  res_7.m_data[2] = 0.0;
  res_7.m_data[3] = 0.0;
  lVar11 = 0;
  pVVar20 = pVVar17;
  pVVar21 = pVVar18;
  do {
    pVVar14 = pVVar20;
    if (*(char *)((long)&srcRbo + lVar11) == '\0') {
      pVVar14 = pVVar21;
    }
    res_7.m_data[lVar11] = pVVar14->m_data[0];
    lVar11 = lVar11 + 1;
    pVVar21 = (Vec4 *)(pVVar21->m_data + 1);
    pVVar20 = (Vec4 *)(pVVar20->m_data + 1);
  } while (lVar11 != 4);
  srcRangeInfo.valueMin.m_data._0_8_ =
       gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader;
  srcRangeInfo.valueMin.m_data._8_8_ =
       gradientToSrcShader.super_ShaderProgram.super_VertexShader.m_inputs.
       super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  srcRangeInfo.valueMax.m_data._0_8_ =
       gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader;
  srcRangeInfo.valueMax.m_data._8_8_ =
       gradientToDstShader.super_ShaderProgram.super_VertexShader.m_inputs.
       super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  srcRangeInfo.lookupScale.m_data[0] = dstRangeInfo.valueMin.m_data[0];
  srcRangeInfo.lookupScale.m_data[1] = dstRangeInfo.valueMin.m_data[1];
  srcRangeInfo.lookupScale.m_data[2] = dstRangeInfo.valueMin.m_data[2];
  srcRangeInfo.lookupScale.m_data[3] = dstRangeInfo.valueMin.m_data[3];
  srcRangeInfo.lookupBias.m_data[0] = res_7.m_data[0];
  srcRangeInfo.lookupBias.m_data[1] = res_7.m_data[1];
  srcRangeInfo.lookupBias.m_data[2] = res_7.m_data[2];
  srcRangeInfo.lookupBias.m_data[3] = res_7.m_data[3];
  srcFbo = uVar22 & uVar24 ^ (uint)DAT_01b805f0 | uVar2;
  gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  gradientToSrcShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pTVar13 = &srcFmtRangeInfo;
  pTVar19 = &dstFmtRangeInfo;
  lVar11 = 0;
  do {
    pTVar15 = pTVar19;
    if (*(char *)((long)&srcFbo + lVar11) == '\0') {
      pTVar15 = pTVar13;
    }
    *(float *)((long)&gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader
              + lVar11 * 4) = (pTVar15->valueMin).m_data[0];
    lVar11 = lVar11 + 1;
    pTVar13 = (TextureFormatInfo *)((pTVar13->valueMin).m_data + 1);
    pTVar19 = (TextureFormatInfo *)((pTVar19->valueMin).m_data + 1);
  } while (lVar11 != 4);
  dstFbo = srcFbo;
  gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  gradientToDstShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lVar11 = 0;
  do {
    pVVar20 = pVVar10;
    if (*(char *)((long)&dstFbo + lVar11) == '\0') {
      pVVar20 = pVVar6;
    }
    *(float *)((long)&gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader
              + lVar11 * 4) = pVVar20->m_data[0];
    lVar11 = lVar11 + 1;
    pVVar6 = (Vec4 *)(pVVar6->m_data + 1);
    pVVar10 = (Vec4 *)(pVVar10->m_data + 1);
  } while (lVar11 != 4);
  srcRbo = srcFbo;
  res_7.m_data[0] = 0.0;
  res_7.m_data[1] = 0.0;
  res_7.m_data[2] = 0.0;
  res_7.m_data[3] = 0.0;
  lVar11 = 0;
  do {
    pVVar6 = pVVar12;
    if (*(char *)((long)&srcRbo + lVar11) == '\0') {
      pVVar6 = pVVar16;
    }
    res_7.m_data[lVar11] = pVVar6->m_data[0];
    VVar4 = res_7;
    lVar11 = lVar11 + 1;
    pVVar16 = (Vec4 *)(pVVar16->m_data + 1);
    pVVar12 = (Vec4 *)(pVVar12->m_data + 1);
  } while (lVar11 != 4);
  dstRbo = srcFbo;
  _res = (undefined1  [16])0x0;
  lVar11 = 0;
  do {
    pVVar6 = pVVar17;
    if (*(char *)((long)res_7.m_data + lVar11 + -4) == '\0') {
      pVVar6 = pVVar18;
    }
    *(float *)(&res)[lVar11].m_data = pVVar6->m_data[0];
    auVar23 = _res;
    lVar11 = lVar11 + 1;
    pVVar18 = (Vec4 *)(pVVar18->m_data + 1);
    pVVar17 = (Vec4 *)(pVVar17->m_data + 1);
  } while (lVar11 != 4);
  dstRangeInfo.valueMin.m_data._0_8_ =
       gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader;
  dstRangeInfo.valueMin.m_data._8_8_ =
       gradientToSrcShader.super_ShaderProgram.super_VertexShader.m_inputs.
       super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  dstRangeInfo.valueMax.m_data._0_8_ =
       gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader;
  dstRangeInfo.valueMax.m_data._8_8_ =
       gradientToDstShader.super_ShaderProgram.super_VertexShader.m_inputs.
       super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  dstRangeInfo.lookupScale.m_data[0] = res_7.m_data[0];
  dstRangeInfo.lookupScale.m_data[1] = res_7.m_data[1];
  dstRangeInfo.lookupScale.m_data[2] = res_7.m_data[2];
  dstRangeInfo.lookupScale.m_data[3] = res_7.m_data[3];
  dstRangeInfo.lookupBias.m_data[0] = (float)res.m_data;
  dstRangeInfo.lookupBias.m_data[1] = fStack_424;
  dstRangeInfo.lookupBias.m_data[2] = afStack_420[0];
  dstRangeInfo.lookupBias.m_data[3] = afStack_420[1];
  res_7 = VVar4;
  _res = auVar23;
  FboTestUtil::GradientShader::GradientShader(&gradientToSrcShader,outputType);
  FboTestUtil::GradientShader::GradientShader(&gradientToDstShader,outputType_00);
  this_00 = &(local_450->super_FboTestCase).super_ContextWrapper;
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_440 = (*pCVar7->_vptr_Context[0x75])(pCVar7,&gradientToSrcShader);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar7->_vptr_Context[0x75])(pCVar7,&gradientToDstShader);
  pdVar9 = &local_450->m_srcFormat;
  pdVar1 = &local_450->m_dstFormat;
  bVar5 = true;
  do {
    bVar3 = bVar5;
    framebuffers = &dstFbo;
    if (bVar3) {
      framebuffers = &srcFbo;
    }
    pdVar8 = pdVar1;
    renderbuffers = &dstRbo;
    if (bVar3) {
      pdVar8 = pdVar9;
      renderbuffers = &srcRbo;
    }
    internalformat = *pdVar8;
    sglr::ContextWrapper::glGenFramebuffers(this_00,1,framebuffers);
    sglr::ContextWrapper::glGenRenderbuffers(this_00,1,renderbuffers);
    sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,*renderbuffers);
    sglr::ContextWrapper::glRenderbufferStorage
              (this_00,0x8d41,internalformat,(local_450->m_size).m_data[0],
               (local_450->m_size).m_data[1]);
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,*framebuffers);
    sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,*renderbuffers);
    FboTestCase::checkError(&local_450->super_FboTestCase);
    FboTestCase::checkFramebufferStatus(&local_450->super_FboTestCase,0x8d40);
    bVar5 = false;
  } while (bVar3);
  sglr::ContextWrapper::glViewport
            (this_00,0,0,(local_450->m_size).m_data[0],(local_450->m_size).m_data[1]);
  bVar5 = true;
  while( true ) {
    pdVar9 = &dstFbo;
    if (bVar5) {
      pdVar9 = &srcFbo;
    }
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,*pdVar9);
    if (!bVar5) break;
    pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
    FboTestUtil::GradientShader::setGradient
              (&gradientToSrcShader,pCVar7,local_440,&srcRangeInfo.valueMin,&dstRangeInfo.valueMax);
    pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
    res_7.m_data._0_12_ = ZEXT812(0xbf800000bf800000);
    _res = (float  [3])ZEXT812(0x3f8000003f800000);
    sglr::drawQuad(pCVar7,local_440,(Vec3 *)&res_7,(Vec3 *)&res);
    bVar5 = false;
  }
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::GradientShader::setGradient
            (&gradientToDstShader,pCVar7,program,&dstRangeInfo.valueMax,&dstRangeInfo.valueMin);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  res_7.m_data._0_12_ = ZEXT812(0xbf800000bf800000);
  _res = (float  [3])ZEXT812(0x3f8000003f800000);
  sglr::drawQuad(pCVar7,program,(Vec3 *)&res_7,(Vec3 *)&res);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca8,srcFbo);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca9,dstFbo);
  srcX1 = (local_450->m_size).m_data[0];
  srcY1 = (local_450->m_size).m_data[1];
  sglr::ContextWrapper::glBlitFramebuffer(this_00,0,0,srcX1,srcY1,0,0,srcX1,srcY1,0x4000,0x2600);
  FboTestCase::checkError(&local_450->super_FboTestCase);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca8,dstFbo);
  FboTestCase::readPixels
            (&local_450->super_FboTestCase,dst,0,0,(local_450->m_size).m_data[0],
             (local_450->m_size).m_data[1],&dstFormat,&dstRangeInfo.lookupScale,
             &dstRangeInfo.lookupBias);
  sglr::ShaderProgram::~ShaderProgram(&gradientToDstShader.super_ShaderProgram);
  sglr::ShaderProgram::~ShaderProgram(&gradientToSrcShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		srcFormat			= glu::mapGLInternalFormat(m_srcFormat);
		tcu::TextureFormat		dstFormat			= glu::mapGLInternalFormat(m_dstFormat);
		glu::DataType			srcOutputType		= getFragmentOutputType(srcFormat);
		glu::DataType			dstOutputType		= getFragmentOutputType(dstFormat);

		// Compute ranges \note Doesn't handle case where src or dest is not subset of the another!
		tcu::TextureFormatInfo	srcFmtRangeInfo		= tcu::getTextureFormatInfo(srcFormat);
		tcu::TextureFormatInfo	dstFmtRangeInfo		= tcu::getTextureFormatInfo(dstFormat);
		tcu::BVec4				copyMask			= tcu::logicalAnd(getChannelMask(srcFormat.order), getChannelMask(dstFormat.order));
		tcu::BVec4				srcIsGreater		= tcu::greaterThan(srcFmtRangeInfo.valueMax-srcFmtRangeInfo.valueMin, dstFmtRangeInfo.valueMax-dstFmtRangeInfo.valueMin);
		tcu::TextureFormatInfo	srcRangeInfo		(tcu::select(dstFmtRangeInfo.valueMin,		srcFmtRangeInfo.valueMin,		tcu::logicalAnd(copyMask, srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.valueMax,		srcFmtRangeInfo.valueMax,		tcu::logicalAnd(copyMask, srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.lookupScale,	srcFmtRangeInfo.lookupScale,	tcu::logicalAnd(copyMask, srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.lookupBias,	srcFmtRangeInfo.lookupBias,		tcu::logicalAnd(copyMask, srcIsGreater)));
		tcu::TextureFormatInfo	dstRangeInfo		(tcu::select(dstFmtRangeInfo.valueMin,		srcFmtRangeInfo.valueMin,		tcu::logicalOr(tcu::logicalNot(copyMask), srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.valueMax,		srcFmtRangeInfo.valueMax,		tcu::logicalOr(tcu::logicalNot(copyMask), srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.lookupScale,	srcFmtRangeInfo.lookupScale,	tcu::logicalOr(tcu::logicalNot(copyMask), srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.lookupBias,	srcFmtRangeInfo.lookupBias,		tcu::logicalOr(tcu::logicalNot(copyMask), srcIsGreater)));

		// Shaders.
		GradientShader			gradientToSrcShader	(srcOutputType);
		GradientShader			gradientToDstShader	(dstOutputType);

		deUint32				gradShaderSrcID		= getCurrentContext()->createProgram(&gradientToSrcShader);
		deUint32				gradShaderDstID		= getCurrentContext()->createProgram(&gradientToDstShader);

		deUint32				srcFbo, dstFbo;
		deUint32				srcRbo, dstRbo;

		// Create framebuffers.
		for (int ndx = 0; ndx < 2; ndx++)
		{
			deUint32&	fbo		= ndx ? dstFbo : srcFbo;
			deUint32&	rbo		= ndx ? dstRbo : srcRbo;
			deUint32	format	= ndx ? m_dstFormat : m_srcFormat;

			glGenFramebuffers(1, &fbo);
			glGenRenderbuffers(1, &rbo);

			glBindRenderbuffer(GL_RENDERBUFFER, rbo);
			glRenderbufferStorage(GL_RENDERBUFFER, format, m_size.x(), m_size.y());

			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
			checkError();
			checkFramebufferStatus(GL_FRAMEBUFFER);
		}

		glViewport(0, 0, m_size.x(), m_size.y());

		// Render gradients.
		for (int ndx = 0; ndx < 2; ndx++)
		{
			glBindFramebuffer(GL_FRAMEBUFFER, ndx ? dstFbo : srcFbo);

			if (ndx)
			{
				gradientToDstShader.setGradient(*getCurrentContext(), gradShaderDstID, dstRangeInfo.valueMax, dstRangeInfo.valueMin);
				sglr::drawQuad(*getCurrentContext(), gradShaderDstID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
			}
			else
			{
				gradientToSrcShader.setGradient(*getCurrentContext(), gradShaderSrcID, srcRangeInfo.valueMin, dstRangeInfo.valueMax);
				sglr::drawQuad(*getCurrentContext(), gradShaderSrcID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
			}
		}

		// Execute copy.
		glBindFramebuffer(GL_READ_FRAMEBUFFER, srcFbo);
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, dstFbo);
		glBlitFramebuffer(0, 0, m_size.x(), m_size.y(), 0, 0, m_size.x(), m_size.y(), GL_COLOR_BUFFER_BIT, GL_NEAREST);
		checkError();

		// Read results.
		glBindFramebuffer(GL_READ_FRAMEBUFFER, dstFbo);
		readPixels(dst, 0, 0, m_size.x(), m_size.y(), dstFormat, dstRangeInfo.lookupScale, dstRangeInfo.lookupBias);
	}